

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::~IfcOccupant(IfcOccupant *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined ***)&this[-1].super_IfcActor.super_IfcObject.field_0x48 = &PTR__IfcOccupant_00901ed0;
  *(undefined ***)&(this->super_IfcActor).super_IfcObject.field_0x30 = &PTR__IfcOccupant_00901f98;
  *(undefined ***)&this[-1].super_IfcActor.super_IfcObject.field_0xd0 = &PTR__IfcOccupant_00901ef8;
  *(undefined ***)&this[-1].super_IfcActor.super_IfcObject.field_0xe0 = &PTR__IfcOccupant_00901f20;
  *(undefined ***)&this[-1].field_0x118 = &PTR__IfcOccupant_00901f48;
  *(undefined ***)&(this->super_IfcActor).super_IfcObject = &PTR__IfcOccupant_00901f70;
  puVar1 = *(undefined1 **)&(this->super_IfcActor).super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcActor).super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcActor::~IfcActor((IfcActor *)&this[-1].super_IfcActor.super_IfcObject.field_0x48,
                      &PTR_construction_vtable_24__00901fb0);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}